

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

int get_free_buffer(DECODER_MODEL *decoder_model)

{
  FRAME_BUFFER *this_buffer;
  int i;
  DECODER_MODEL *decoder_model_local;
  
  i = 0;
  while( true ) {
    if (9 < i) {
      return -1;
    }
    if ((decoder_model->frame_buffer_pool[i].decoder_ref_count == 0) &&
       (decoder_model->frame_buffer_pool[i].player_ref_count == 0)) break;
    i = i + 1;
  }
  return i;
}

Assistant:

static int get_free_buffer(DECODER_MODEL *const decoder_model) {
  for (int i = 0; i < BUFFER_POOL_MAX_SIZE; ++i) {
    const FRAME_BUFFER *const this_buffer =
        &decoder_model->frame_buffer_pool[i];
    if (this_buffer->decoder_ref_count == 0 &&
        this_buffer->player_ref_count == 0)
      return i;
  }
  return -1;
}